

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_qcache.c
# Opt level: O1

void ares_qcache_entry_destroy_cb(void *arg)

{
  ares_qcache_entry_t *entry;
  
  if (arg != (void *)0x0) {
    ares_free(*arg);
    ares_dns_record_destroy(*(ares_dns_record_t **)((long)arg + 8));
    ares_free(arg);
    return;
  }
  return;
}

Assistant:

static void ares_qcache_entry_destroy_cb(void *arg)
{
  ares_qcache_entry_t *entry = arg;
  if (entry == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  ares_free(entry->key);
  ares_dns_record_destroy(entry->dnsrec);
  ares_free(entry);
}